

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_boost_po::
add_to_description_impl<VW::config::typelist<bool,std::vector<int,std::allocator<int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  bool bVar1;
  options_description *in_RDX;
  options_boost_po *in_RSI;
  options_boost_po *in_RDI;
  shared_ptr<VW::config::base_option> *in_stack_ffffffffffffff88;
  shared_ptr<VW::config::base_option> *in_stack_ffffffffffffff90;
  shared_ptr<VW::config::base_option> local_48 [2];
  options_description *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<VW::config::base_option>::shared_ptr
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = add_if_t<bool>(in_RDI,(shared_ptr<VW::config::base_option> *)in_RSI,in_RDX);
  std::shared_ptr<VW::config::base_option>::~shared_ptr
            ((shared_ptr<VW::config::base_option> *)0x154965);
  if (!bVar1) {
    std::shared_ptr<VW::config::base_option>::shared_ptr(local_48,in_stack_ffffffffffffff88);
    add_to_description_impl<VW::config::typelist<std::vector<int,std::allocator<int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_RSI,(shared_ptr<VW::config::base_option> *)in_RDX,in_stack_ffffffffffffffe0);
    std::shared_ptr<VW::config::base_option>::~shared_ptr
              ((shared_ptr<VW::config::base_option> *)0x1549bf);
  }
  return;
}

Assistant:

void add_to_description_impl(std::shared_ptr<base_option> opt, po::options_description& options_description)
  {
    if (add_if_t<typename TTypes::head>(opt, options_description))
    {
      return;
    }
    add_to_description_impl<typename TTypes::tail>(opt, options_description);
  }